

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connected_proxy(connectdata *conn,int sockindex)

{
  uint local_4c;
  uint local_48;
  uint local_44;
  char *local_40;
  char *local_38;
  char *local_30;
  int port;
  char *host;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  host._0_4_ = CURLE_OK;
  if ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) != 0) {
    if ((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) {
      if ((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) == 0) {
        if (sockindex == 1) {
          local_40 = conn->secondaryhostname;
        }
        else {
          local_40 = (conn->host).name;
        }
        local_38 = local_40;
      }
      else {
        local_38 = (conn->conn_to_host).name;
      }
      local_30 = local_38;
    }
    else {
      local_30 = (conn->http_proxy).host.name;
    }
    if ((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) {
      if (sockindex == 1) {
        local_48 = (uint)conn->secondary_port;
      }
      else {
        if ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) == 0) {
          local_4c = conn->remote_port;
        }
        else {
          local_4c = conn->conn_to_port;
        }
        local_48 = local_4c;
      }
      local_44 = local_48;
    }
    else {
      local_44 = (uint)(conn->http_proxy).port;
    }
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 | 0x40000000;
    switch((conn->socks_proxy).proxytype) {
    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      host._0_4_ = Curl_SOCKS4((conn->socks_proxy).user,local_30,local_44,sockindex,conn);
      break;
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      host._0_4_ = Curl_SOCKS5((conn->socks_proxy).user,(conn->socks_proxy).passwd,local_30,local_44
                               ,sockindex,conn);
      break;
    default:
      Curl_failf(conn->data,"unknown proxytype option given");
      host._0_4_ = CURLE_COULDNT_CONNECT;
    }
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xbfffffff;
  }
  return (CURLcode)host;
}

Assistant:

CURLcode Curl_connected_proxy(struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.socksproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host = conn->bits.httpproxy ?
                              conn->http_proxy.host.name :
                              conn->bits.conn_to_host ?
                              conn->conn_to_host.name :
                              sockindex == SECONDARYSOCKET ?
                              conn->secondaryhostname : conn->host.name;
    const int port = conn->bits.httpproxy ? (int)conn->http_proxy.port :
                     sockindex == SECONDARYSOCKET ? conn->secondary_port :
                     conn->bits.conn_to_port ? conn->conn_to_port :
                     conn->remote_port;
    conn->bits.socksproxy_connecting = TRUE;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      result = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                         host, port, sockindex, conn);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      result = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                           conn);
      break;

    default:
      failf(conn->data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    conn->bits.socksproxy_connecting = FALSE;
#else
  (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
  }

  return result;
}